

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqPubSub.cpp
# Opt level: O1

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqPubSub::Receive(ZmqPubSub *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *buff;
  long in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar2;
  int ret;
  undefined1 local_1d;
  int local_1c;
  
  local_1c = zmq_recv(*(undefined8 *)(in_RSI + 8),*(long *)(in_RSI + 0x10),
                      *(long *)(in_RSI + 0x18) - *(long *)(in_RSI + 0x10),1);
  if (local_1c < 1) {
    this->m_ZmqContext = (void *)0x0;
    this->m_ZmqSocket = (void *)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    this->m_ZmqContext = (void *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_ZmqSocket,
               (vector<char,_std::allocator<char>_> **)this,
               (allocator<std::vector<char,_std::allocator<char>_>_> *)&local_1d,&local_1c);
    memcpy(*this->m_ZmqContext,*(void **)(in_RSI + 0x10),(long)local_1c);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar2.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqPubSub::Receive()
{
    int ret = zmq_recv(m_ZmqSocket, m_ReceiverBuffer.data(), m_ReceiverBuffer.size(), ZMQ_DONTWAIT);
    if (ret > 0)
    {
        auto buff = std::make_shared<std::vector<char>>(ret);
        std::memcpy(buff->data(), m_ReceiverBuffer.data(), ret);
        return buff;
    }
    return nullptr;
}